

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O1

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  size_t sVar2;
  char *__s;
  
  __s = *pointer;
  _Var1._M_head_impl =
       (this->ss_)._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (__s == (char *)0x0) {
    __s = "(null)";
    sVar2 = 6;
  }
  else {
    sVar2 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(_Var1._M_head_impl + 0x10),__s,sVar2);
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == nullptr) {
      *ss_ << "(null)";
    } else {
      *ss_ << pointer;
    }
    return *this;
  }